

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O2

bool dxil_spv::analyze_dxil_buffer_access_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  bool bVar2;
  TypeID TVar3;
  uint uVar4;
  mapped_type *pmVar5;
  iterator iVar6;
  AccessTracking *tracking;
  iterator iVar7;
  Type *pTVar8;
  RawBufferMeta RVar9;
  uint32_t opcode;
  Value *local_30;
  
  bVar1 = get_constant_operand(&instruction->super_Instruction,0,&opcode);
  if (!bVar1) {
    return bVar1;
  }
  switch(opcode) {
  case 0x44:
switchD_0014db8b_caseD_44:
    analyze_dxil_buffer_load(impl,instruction,opcode);
    break;
  case 0x46:
    local_30 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    iVar6 = std::
            _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(impl->llvm_value_to_uav_resource_index_map)._M_h,&local_30);
    if (iVar6.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
        _M_cur != (__node_type *)0x0) {
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->uav_access_tracking,
                            (key_type *)
                            ((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>
                                   ._M_cur + 0x10));
      pmVar5->has_counter = true;
    }
    break;
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
    break;
  case 0x4e:
  case 0x4f:
switchD_0014db8b_caseD_4e:
    local_30 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    iVar6 = std::
            _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(impl->llvm_value_to_uav_resource_index_map)._M_h,&local_30);
    if (iVar6.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      tracking = (mapped_type *)0x0;
    }
    else {
      if ((*(uint32_t *)
            ((long)iVar6.
                   super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>
                   ._M_cur + 0x10) == (impl->ags).uav_magic_resource_type_index) &&
         (bVar2 = value_is_dx_op_instrinsic((Value *)instruction,AtomicCompareExchange), bVar2)) {
        Converter::Impl::push_ags_instruction(impl,instruction);
        return bVar1;
      }
      tracking = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::AccessTracking>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->uav_access_tracking,
                              (key_type *)
                              ((long)iVar6.
                                     super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>
                                     ._M_cur + 0x10));
    }
    local_30 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    iVar7 = std::
            _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(impl->llvm_annotate_handle_uses)._M_h,&local_30);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
        ._M_cur == (__node_type *)0x0) {
      if (tracking == (mapped_type *)0x0) {
        return bVar1;
      }
    }
    else {
      tracking = (AccessTracking *)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_false>
                        ._M_cur + 0x17);
    }
    tracking->has_read = true;
    tracking->has_written = true;
    tracking->has_atomic = true;
    pTVar8 = LLVMBC::Value::getType((Value *)instruction);
    TVar3 = LLVMBC::Type::getTypeID(pTVar8);
    if (TVar3 == VoidTyID) {
LAB_0014dcf2:
      tracking->has_atomic_64bit = true;
    }
    else {
      pTVar8 = LLVMBC::Value::getType((Value *)instruction);
      uVar4 = LLVMBC::Type::getIntegerBitWidth(pTVar8);
      if (uVar4 == 0x40) goto LAB_0014dcf2;
    }
    RVar9 = get_resource_meta_from_buffer_op(impl,instruction);
    if ((byte)(RVar9.kind - RawBuffer) < 2) {
      pTVar8 = LLVMBC::Value::getType((Value *)instruction);
      update_raw_access_tracking_from_vector_type(tracking,pTVar8,V1);
    }
    (impl->shader_analysis).has_side_effects = true;
    break;
  default:
    if (opcode - 0xae < 4) goto switchD_0014db8b_caseD_4e;
    if (opcode != 0x8c) {
      if (opcode != 0x8b) {
        return bVar1;
      }
      goto switchD_0014db8b_caseD_44;
    }
  case 0x43:
  case 0x45:
    analyze_dxil_buffer_store(impl,instruction,opcode);
  }
  return bVar1;
}

Assistant:

bool analyze_dxil_buffer_access_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	// The opcode is encoded as a constant integer.
	uint32_t opcode;
	if (!get_constant_operand(instruction, 0, &opcode))
		return false;

	auto op = static_cast<DXIL::Op>(opcode);

	switch (op)
	{
	case DXIL::Op::BufferLoad:
	case DXIL::Op::RawBufferLoad:
		analyze_dxil_buffer_load(impl, instruction, op);
		break;

	case DXIL::Op::AtomicCompareExchange:
	case DXIL::Op::AtomicBinOp:
	case DXIL::Op::WriteSamplerFeedback:
	case DXIL::Op::WriteSamplerFeedbackBias:
	case DXIL::Op::WriteSamplerFeedbackGrad:
	case DXIL::Op::WriteSamplerFeedbackLevel:
		// Writing sampler feedback is more or less equivalent to an atomic.
		if (!analyze_dxil_atomic_op(impl, instruction))
			return false;
		break;

	case DXIL::Op::TextureStore:
	case DXIL::Op::BufferStore:
	case DXIL::Op::RawBufferStore:
		// TextureStore only needed here to track AGS U64 image atomics.
		analyze_dxil_buffer_store(impl, instruction, op);
		break;

	case DXIL::Op::BufferUpdateCounter:
		analyze_dxil_atomic_counter(impl, instruction);
		break;

	default:
		break;
	}

	return true;
}